

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O1

bool __thiscall duckdb_re2::DFA::InlinedSearchLoop<false,true,true>(DFA *this,SearchParams *params)

{
  byte bVar1;
  bool bVar2;
  State *pSVar3;
  State *pSVar4;
  State *state;
  byte *pbVar5;
  uint uVar6;
  uint c;
  byte *pbVar7;
  byte *pbVar8;
  size_t sVar9;
  ulong uVar10;
  byte *pbVar11;
  long lVar12;
  Prog *local_228;
  Prog *local_220;
  StateSaver local_218;
  byte *local_1f0;
  byte *local_1e8;
  StateSaver local_1e0;
  Prog *local_1b8;
  undefined1 local_1b0;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  pbVar7 = (byte *)(params->text).data_;
  pSVar4 = params->start;
  if ((pSVar4->flag_ & 0x100) == 0) {
    local_1e8 = pbVar7 + (params->text).size_;
    local_228 = this->prog_;
    pbVar11 = (byte *)0x0;
    local_220 = (Prog *)0x0;
    pbVar5 = (byte *)0x0;
    state = pSVar4;
    local_1b8 = local_228;
    do {
      if (pbVar7 == local_1e8) {
        pbVar5 = (byte *)((params->text).data_ + (params->text).size_);
        if (pbVar5 == (byte *)((params->context).data_ + (params->context).size_)) {
          c = 0x100;
        }
        else {
          c = (uint)*pbVar5;
        }
        if (c == 0x100) {
          uVar6 = this->prog_->bytemap_range_;
        }
        else {
          uVar6 = (uint)this->prog_->bytemap_[c];
        }
        pSVar4 = state->next_[(int)uVar6]._M_b._M_p;
        if ((pSVar4 == (State *)0x0) &&
           (pSVar4 = RunStateOnByteUnlocked(this,state,c), pSVar4 == (State *)0x0)) {
          if (state < (State *)0x3) {
            local_218.inst_ = (int *)0x0;
            local_218.ninst_ = 0;
            local_218.flag_ = 0;
            local_218.is_special_ = true;
            local_218.dfa_ = this;
            local_218.special_ = state;
          }
          else {
            local_218.is_special_ = false;
            local_218.special_ = (State *)0x0;
            local_218.ninst_ = state->ninst_;
            local_218.flag_ = state->flag_;
            lVar12 = (long)local_218.ninst_;
            uVar10 = 0xffffffffffffffff;
            if (-1 < local_218.ninst_) {
              uVar10 = lVar12 * 4;
            }
            local_218.dfa_ = this;
            local_218.inst_ = (int *)operator_new__(uVar10);
            memmove(local_218.inst_,state->inst_,lVar12 * 4);
          }
          ResetCache(this,params->cache_lock);
          pSVar4 = StateSaver::Restore(&local_218);
          if (pSVar4 == (State *)0x0) {
LAB_011ed874:
            params->failed = true;
            bVar2 = false;
            pSVar4 = (State *)0x0;
            local_228._0_1_ = 0;
          }
          else {
            pSVar4 = RunStateOnByteUnlocked(this,pSVar4,c);
            if (pSVar4 == (State *)0x0) {
              local_1b0 = 0;
              std::__cxx11::ostringstream::ostringstream(local_1a8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"RunStateOnByteUnlocked failed after Reset",0x29);
              std::__cxx11::ostringstream::~ostringstream(local_1a8);
              std::ios_base::~ios_base(local_138);
              goto LAB_011ed874;
            }
            bVar2 = true;
          }
          if ((local_218.is_special_ == false) && (local_218.inst_ != (int *)0x0)) {
            operator_delete__(local_218.inst_);
          }
          if (!bVar2) break;
        }
        if (pSVar4 < (State *)0x3) {
          if (pSVar4 == (State *)&DAT_00000001) goto LAB_011ed923;
          params->ep = (char *)local_1e8;
          goto LAB_011ed70f;
        }
        if (((((pSVar4->flag_ & 0x100) == 0) ||
             (local_220._0_1_ = 1, pbVar11 = pbVar7, params->matches == (SparseSet *)0x0)) ||
            (this->kind_ != kManyMatch)) || ((long)pSVar4->ninst_ < 1)) goto LAB_011ed923;
        lVar12 = (long)pSVar4->ninst_ + 1;
        goto LAB_011ed8de;
      }
      pbVar8 = pbVar7 + 1;
      bVar1 = *pbVar7;
      pSVar3 = state->next_[local_1b8->bytemap_[bVar1]]._M_b._M_p;
      if (pSVar3 == (State *)0x0) {
        local_1f0 = pbVar8;
        pSVar3 = RunStateOnByteUnlocked(this,state,(uint)bVar1);
        pbVar8 = local_1f0;
        if (pSVar3 != (State *)0x0) goto LAB_011ed3ac;
        if (((dfa_should_bail_when_slow == '\x01') && (pbVar5 != (byte *)0x0)) &&
           (((ulong)((long)local_1f0 - (long)pbVar5) <
             (this->state_cache_)._M_h._M_element_count * 10 && (this->kind_ != kManyMatch)))) {
          params->failed = true;
          bVar2 = false;
          local_228 = (Prog *)0x0;
          pSVar3 = state;
        }
        else {
          if (pSVar4 < (State *)0x3) {
            local_218.inst_ = (int *)0x0;
            local_218.ninst_ = 0;
            local_218.flag_ = 0;
            local_218.is_special_ = true;
            local_218.dfa_ = this;
            local_218.special_ = pSVar4;
          }
          else {
            local_218.is_special_ = false;
            local_218.special_ = (State *)0x0;
            local_218.ninst_ = pSVar4->ninst_;
            local_218.flag_ = pSVar4->flag_;
            lVar12 = (long)local_218.ninst_;
            sVar9 = lVar12 * 4;
            if (local_218.ninst_ < 0) {
              sVar9 = 0xffffffffffffffff;
            }
            local_218.dfa_ = this;
            local_218.inst_ = (int *)operator_new__(sVar9);
            memmove(local_218.inst_,pSVar4->inst_,lVar12 * 4);
          }
          local_1e0.dfa_ = this;
          if (state < (State *)0x3) {
            local_1e0.inst_ = (int *)0x0;
            local_1e0.ninst_ = 0;
            local_1e0.flag_ = 0;
            local_1e0.is_special_ = true;
            local_1e0.special_ = state;
          }
          else {
            local_1e0.is_special_ = false;
            local_1e0.special_ = (State *)0x0;
            local_1e0.ninst_ = state->ninst_;
            local_1e0.flag_ = state->flag_;
            lVar12 = (long)local_1e0.ninst_;
            sVar9 = lVar12 * 4;
            if (local_1e0.ninst_ < 0) {
              sVar9 = 0xffffffffffffffff;
            }
            local_1e0.inst_ = (int *)operator_new__(sVar9);
            memmove(local_1e0.inst_,state->inst_,lVar12 * 4);
          }
          ResetCache(this,params->cache_lock);
          pSVar4 = StateSaver::Restore(&local_218);
          if (pSVar4 == (State *)0x0) {
LAB_011ed651:
            params->failed = true;
            bVar2 = false;
            pSVar3 = (State *)0x0;
            local_228 = (Prog *)0x0;
          }
          else {
            state = StateSaver::Restore(&local_1e0);
            if (state == (State *)0x0) {
              state = (State *)0x0;
              goto LAB_011ed651;
            }
            pSVar3 = RunStateOnByteUnlocked(this,state,(uint)bVar1);
            if (pSVar3 == (State *)0x0) {
              local_1b0 = 0;
              std::__cxx11::ostringstream::ostringstream(local_1a8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"RunStateOnByteUnlocked failed after ResetCache",0x2e)
              ;
              std::__cxx11::ostringstream::~ostringstream(local_1a8);
              std::ios_base::~ios_base(local_138);
              goto LAB_011ed651;
            }
            bVar2 = true;
          }
          if ((local_1e0.is_special_ == false) && (local_1e0.inst_ != (int *)0x0)) {
            operator_delete__(local_1e0.inst_);
          }
          if ((local_218.is_special_ == false) && (local_218.inst_ != (int *)0x0)) {
            operator_delete__(local_218.inst_);
          }
          pbVar8 = local_1f0;
          pbVar5 = local_1f0;
          if (bVar2) goto LAB_011ed3ac;
          bVar2 = false;
          pSVar3 = state;
        }
      }
      else {
LAB_011ed3ac:
        if (pSVar3 < (State *)0x3) {
          if (pSVar3 == (State *)&DAT_00000001) {
            params->ep = (char *)pbVar11;
            bVar2 = false;
            local_228 = local_220;
            pSVar3 = state;
          }
          else {
            params->ep = (char *)local_1e8;
            local_228 = (Prog *)0x1;
            bVar2 = false;
            pSVar3 = state;
          }
        }
        else {
          bVar2 = true;
          if ((pSVar3->flag_ & 0x100) != 0) {
            if (((params->matches != (SparseSet *)0x0) && (this->kind_ == kManyMatch)) &&
               (0 < (long)pSVar3->ninst_)) {
              lVar12 = (long)pSVar3->ninst_ + 1;
              do {
                if (pSVar3->inst_[lVar12 + -2] == -2) break;
                SparseSetT<void>::InsertInternal(params->matches,true,pSVar3->inst_[lVar12 + -2]);
                lVar12 = lVar12 + -1;
              } while (1 < lVar12);
            }
            params->ep = (char *)pbVar7;
            local_220 = (Prog *)0x1;
            bVar2 = false;
            local_228 = (Prog *)0x1;
            pbVar11 = pbVar7;
          }
        }
      }
      pbVar7 = pbVar8;
      state = pSVar3;
    } while (bVar2);
  }
  else {
    if (((params->matches != (SparseSet *)0x0) && (this->kind_ == kManyMatch)) &&
       (0 < (long)pSVar4->ninst_)) {
      lVar12 = (long)pSVar4->ninst_ + 1;
      do {
        if (pSVar4->inst_[lVar12 + -2] == -2) break;
        SparseSetT<void>::InsertInternal(params->matches,true,pSVar4->inst_[lVar12 + -2]);
        lVar12 = lVar12 + -1;
      } while (1 < lVar12);
    }
    params->ep = (char *)pbVar7;
LAB_011ed70f:
    local_228._0_1_ = 1;
  }
LAB_011ed935:
  return (bool)((byte)local_228 & 1);
  while( true ) {
    SparseSetT<void>::InsertInternal(params->matches,true,pSVar4->inst_[lVar12 + -2]);
    lVar12 = lVar12 + -1;
    if (lVar12 < 2) break;
LAB_011ed8de:
    if (pSVar4->inst_[lVar12 + -2] == -2) break;
  }
LAB_011ed923:
  params->ep = (char *)pbVar11;
  local_228._0_1_ = (byte)local_220;
  goto LAB_011ed935;
}

Assistant:

inline bool DFA::InlinedSearchLoop(SearchParams* params) {
  State* start = params->start;
  const uint8_t* bp = BytePtr(params->text.data());  // start of text
  const uint8_t* p = bp;                             // text scanning point
  const uint8_t* ep = BytePtr(params->text.data() +
                              params->text.size());  // end of text
  const uint8_t* resetp = NULL;                      // p at last cache reset
  if (!run_forward) {
    using std::swap;
    swap(p, ep);
  }

  const uint8_t* bytemap = prog_->bytemap();
  const uint8_t* lastmatch = NULL;   // most recent matching position in text
  bool matched = false;

  State* s = start;

  if (s->IsMatch()) {
    matched = true;
    lastmatch = p;
    if (params->matches != NULL && kind_ == Prog::kManyMatch) {
      for (int i = s->ninst_ - 1; i >= 0; i--) {
        int id = s->inst_[i];
        if (id == MatchSep)
          break;
        params->matches->insert(id);
      }
    }
    if (want_earliest_match) {
      params->ep = reinterpret_cast<const char*>(lastmatch);
      return true;
    }
  }

  while (p != ep) {

    if (can_prefix_accel && s == start) {
      // In start state, only way out is to find the prefix,
      // so we use prefix accel (e.g. memchr) to skip ahead.
      // If not found, we can skip to the end of the string.
      p = BytePtr(prog_->PrefixAccel(p, ep - p));
      if (p == NULL) {
        p = ep;
        break;
      }
    }

    int c;
    if (run_forward)
      c = *p++;
    else
      c = *--p;

    // Note that multiple threads might be consulting
    // s->next_[bytemap[c]] simultaneously.
    // RunStateOnByte takes care of the appropriate locking,
    // including a memory barrier so that the unlocked access
    // (sometimes known as "double-checked locking") is safe.
    // The alternative would be either one DFA per thread
    // or one mutex operation per input byte.
    //
    // ns == DeadState means the state is known to be dead
    // (no more matches are possible).
    // ns == NULL means the state has not yet been computed
    // (need to call RunStateOnByteUnlocked).
    // RunStateOnByte returns ns == NULL if it is out of memory.
    // ns == FullMatchState means the rest of the string matches.
    //
    // Okay to use bytemap[] not ByteMap() here, because
    // c is known to be an actual byte and not kByteEndText.

    State* ns = s->next_[bytemap[c]].load(std::memory_order_acquire);
    if (ns == NULL) {
      ns = RunStateOnByteUnlocked(s, c);
      if (ns == NULL) {
        // After we reset the cache, we hold cache_mutex exclusively,
        // so if resetp != NULL, it means we filled the DFA state
        // cache with this search alone (without any other threads).
        // Benchmarks show that doing a state computation on every
        // byte runs at about 0.2 MB/s, while the NFA (nfa.cc) can do the
        // same at about 2 MB/s.  Unless we're processing an average
        // of 10 bytes per state computation, fail so that RE2 can
        // fall back to the NFA.  However, RE2::Set cannot fall back,
        // so we just have to keep on keeping on in that case.
        if (dfa_should_bail_when_slow && resetp != NULL &&
            static_cast<size_t>(p - resetp) < 10*state_cache_.size() &&
            kind_ != Prog::kManyMatch) {
          params->failed = true;
          return false;
        }
        resetp = p;

        // Prepare to save start and s across the reset.
        StateSaver save_start(this, start);
        StateSaver save_s(this, s);

        // Discard all the States in the cache.
        ResetCache(params->cache_lock);

        // Restore start and s so we can continue.
        if ((start = save_start.Restore()) == NULL ||
            (s = save_s.Restore()) == NULL) {
          // Restore already did LOG(DFATAL).
          params->failed = true;
          return false;
        }
        ns = RunStateOnByteUnlocked(s, c);
        if (ns == NULL) {
          LOG(DFATAL) << "RunStateOnByteUnlocked failed after ResetCache";
          params->failed = true;
          return false;
        }
      }
    }
    if (ns <= SpecialStateMax) {
      if (ns == DeadState) {
        params->ep = reinterpret_cast<const char*>(lastmatch);
        return matched;
      }
      // FullMatchState
      params->ep = reinterpret_cast<const char*>(ep);
      return true;
    }

    s = ns;
    if (s->IsMatch()) {
      matched = true;
      // The DFA notices the match one byte late,
      // so adjust p before using it in the match.
      if (run_forward)
        lastmatch = p - 1;
      else
        lastmatch = p + 1;
      if (params->matches != NULL && kind_ == Prog::kManyMatch) {
        for (int i = s->ninst_ - 1; i >= 0; i--) {
          int id = s->inst_[i];
          if (id == MatchSep)
            break;
          params->matches->insert(id);
        }
      }
      if (want_earliest_match) {
        params->ep = reinterpret_cast<const char*>(lastmatch);
        return true;
      }
    }
  }

  // Process one more byte to see if it triggers a match.
  // (Remember, matches are delayed one byte.)

  int lastbyte;
  if (run_forward) {
    if (EndPtr(params->text) == EndPtr(params->context))
      lastbyte = kByteEndText;
    else
      lastbyte = EndPtr(params->text)[0] & 0xFF;
  } else {
    if (BeginPtr(params->text) == BeginPtr(params->context))
      lastbyte = kByteEndText;
    else
      lastbyte = BeginPtr(params->text)[-1] & 0xFF;
  }

  State* ns = s->next_[ByteMap(lastbyte)].load(std::memory_order_acquire);
  if (ns == NULL) {
    ns = RunStateOnByteUnlocked(s, lastbyte);
    if (ns == NULL) {
      StateSaver save_s(this, s);
      ResetCache(params->cache_lock);
      if ((s = save_s.Restore()) == NULL) {
        params->failed = true;
        return false;
      }
      ns = RunStateOnByteUnlocked(s, lastbyte);
      if (ns == NULL) {
        LOG(DFATAL) << "RunStateOnByteUnlocked failed after Reset";
        params->failed = true;
        return false;
      }
    }
  }
  if (ns <= SpecialStateMax) {
    if (ns == DeadState) {
      params->ep = reinterpret_cast<const char*>(lastmatch);
      return matched;
    }
    // FullMatchState
    params->ep = reinterpret_cast<const char*>(ep);
    return true;
  }

  s = ns;
  if (s->IsMatch()) {
    matched = true;
    lastmatch = p;
    if (params->matches != NULL && kind_ == Prog::kManyMatch) {
      for (int i = s->ninst_ - 1; i >= 0; i--) {
        int id = s->inst_[i];
        if (id == MatchSep)
          break;
        params->matches->insert(id);
      }
    }
  }

  params->ep = reinterpret_cast<const char*>(lastmatch);
  return matched;
}